

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log4z.h
# Opt level: O2

void __thiscall zsummer::log4z::CStringStream::WriteData<int>(CStringStream *this,char *ft,int t)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  
  pcVar2 = this->m_pCur;
  if (this->m_pEnd <= pcVar2) {
    return;
  }
  iVar3 = (int)this->m_pEnd - (int)pcVar2;
  iVar1 = snprintf(pcVar2,(long)iVar3,ft,t);
  if (iVar1 < 0) {
    pcVar2 = this->m_pCur;
    iVar1 = 0;
  }
  else {
    if (iVar1 < iVar3) goto LAB_00119904;
    pcVar2 = this->m_pEnd + -1;
    iVar1 = iVar3;
  }
  *pcVar2 = '\0';
LAB_00119904:
  this->m_pCur = this->m_pCur + iVar1;
  return;
}

Assistant:

inline void WriteData(const char * ft, T t)
	{
		if (m_pCur < m_pEnd)
		{
			int len = 0;
			int count = (int)(m_pEnd - m_pCur);
#if defined(WIN32) || defined(WIN64)
			len = _snprintf(m_pCur, count, ft, t);
			if (len == count || (len == -1 && errno == ERANGE))
			{
				len = count;
				*(m_pEnd-1) = '\0';
			}
			else if (len < 0)
			{
				*m_pCur = '\0';
				len = 0;
			}
#else
			len = snprintf(m_pCur, count, ft, t);
			if (len < 0)
			{
				*m_pCur = '\0';
				len = 0;
			}
			else if (len >= count)
			{
				len = count;
				*(m_pEnd-1) = '\0';
			}
#endif
			m_pCur += len;
		}
	}